

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *structNode,Reader *replacement,uint64_t scopeId,
          uint64_t replacementScopeId)

{
  uint uVar1;
  uint uVar2;
  ElementCount EVar3;
  ushort uVar4;
  int iVar5;
  CapTableReader *pCVar6;
  ElementCount index;
  ushort uVar7;
  int iVar8;
  Reader replacementFields;
  Reader fields;
  ListReader local_f0;
  ListReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x80) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ushort *)((long)(replacement->_reader).data + 0xe);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0x80) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0xe);
  }
  if (uVar7 < uVar4) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0x80) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ushort *)((long)(replacement->_reader).data + 0xe);
    }
    if (uVar2 < 0x80) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0xe);
    }
    if (uVar4 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0xd0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ushort *)((long)(replacement->_reader).data + 0x18);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0xd0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x18);
  }
  if (uVar7 < uVar4) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0xd0) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ushort *)((long)(replacement->_reader).data + 0x18);
    }
    if (uVar2 < 0xd0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x18);
    }
    if (uVar4 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x100) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ushort *)((long)(replacement->_reader).data + 0x1e);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0x100) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
  }
  if (uVar7 < uVar4) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0x100) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ushort *)((long)(replacement->_reader).data + 0x1e);
    }
    if (uVar2 < 0x100) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
    }
    if (uVar4 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if ((((0xff < uVar1) && (*(short *)((long)(replacement->_reader).data + 0x1e) != 0)) &&
      (uVar2 = (structNode->_reader).dataSize, 0xff < uVar2)) &&
     (*(short *)((long)(structNode->_reader).data + 0x1e) != 0)) {
    iVar5 = 0;
    iVar8 = 0;
    if (0x11f < uVar1) {
      iVar8 = *(int *)((long)(replacement->_reader).data + 0x20);
    }
    if (0x11f < uVar2) {
      iVar5 = *(int *)((long)(structNode->_reader).data + 0x20);
    }
    if (iVar8 != iVar5) {
      checkCompatibility(this);
      return;
    }
  }
  iVar8 = 0x7fffffff;
  if ((structNode->_reader).pointerCount < 4) {
    local_f0.capTable = (CapTableReader *)0x0;
    local_f0.ptr = (byte *)0x0;
    local_f0.segment = (SegmentReader *)0x0;
    local_f0.elementCount = 0x7fffffff;
  }
  else {
    local_f0.segment = (structNode->_reader).segment;
    local_f0.capTable = (structNode->_reader).capTable;
    local_f0.ptr = (byte *)((structNode->_reader).pointers + 3);
    local_f0.elementCount = (structNode->_reader).nestingLimit;
  }
  pCVar6 = (CapTableReader *)0x0;
  _::PointerReader::getList(&local_c0,(PointerReader *)&local_f0,INLINE_COMPOSITE,(word *)0x0);
  local_90.data = (WirePointer *)0x0;
  local_90.segment = (SegmentReader *)0x0;
  if (3 < (replacement->_reader).pointerCount) {
    local_90.segment = (replacement->_reader).segment;
    pCVar6 = (replacement->_reader).capTable;
    local_90.data = (replacement->_reader).pointers + 3;
    iVar8 = (replacement->_reader).nestingLimit;
  }
  local_90.capTable = pCVar6;
  local_90.pointers._0_4_ = iVar8;
  _::PointerReader::getList(&local_f0,(PointerReader *)&local_90,INLINE_COMPOSITE,(word *)0x0);
  EVar3 = local_c0.elementCount;
  if (local_f0.elementCount < local_c0.elementCount) {
    EVar3 = local_f0.elementCount;
  }
  if (local_c0.elementCount < local_f0.elementCount) {
    replacementIsNewer(this);
  }
  else if (local_f0.elementCount < local_c0.elementCount) {
    replacementIsOlder(this);
  }
  if (EVar3 != 0) {
    index = 0;
    do {
      _::ListReader::getStructElement(&local_90,&local_c0,index);
      _::ListReader::getStructElement(&local_60,&local_f0,index);
      checkCompatibility(this,(Reader *)&local_90,(Reader *)&local_60);
      index = index + 1;
    } while (EVar3 != index);
  }
  if (((structNode->_reader).dataSize < 0xe1) ||
     ((*(byte *)((long)(structNode->_reader).data + 0x1c) & 1) == 0)) {
    if ((0xe0 < (replacement->_reader).dataSize) &&
       ((*(byte *)((long)(replacement->_reader).data + 0x1c) & 1) != 0)) {
      replacementIsNewer(this);
    }
  }
  else if (((replacement->_reader).dataSize < 0xe1) ||
          ((*(byte *)((long)(replacement->_reader).data + 0x1c) & 1) == 0)) {
    replacementIsOlder(this);
  }
  else if (replacementScopeId != scopeId) {
    checkCompatibility(this);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Struct::Reader& structNode,
                          const schema::Node::Struct::Reader& replacement,
                          uint64_t scopeId, uint64_t replacementScopeId) {
    if (replacement.getDataWordCount() > structNode.getDataWordCount()) {
      replacementIsNewer();
    } else if (replacement.getDataWordCount() < structNode.getDataWordCount()) {
      replacementIsOlder();
    }
    if (replacement.getPointerCount() > structNode.getPointerCount()) {
      replacementIsNewer();
    } else if (replacement.getPointerCount() < structNode.getPointerCount()) {
      replacementIsOlder();
    }
    if (replacement.getDiscriminantCount() > structNode.getDiscriminantCount()) {
      replacementIsNewer();
    } else if (replacement.getDiscriminantCount() < structNode.getDiscriminantCount()) {
      replacementIsOlder();
    }

    if (replacement.getDiscriminantCount() > 0 && structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset(),
                      "union discriminant position changed");
    }

    // The shared members should occupy corresponding positions in the member lists, since the
    // lists are sorted by ordinal.
    auto fields = structNode.getFields();
    auto replacementFields = replacement.getFields();
    uint count = std::min(fields.size(), replacementFields.size());

    if (replacementFields.size() > fields.size()) {
      replacementIsNewer();
    } else if (replacementFields.size() < fields.size()) {
      replacementIsOlder();
    }

    for (uint i = 0; i < count; i++) {
      checkCompatibility(fields[i], replacementFields[i]);
    }

    // For the moment, we allow "upgrading" from non-group to group, mainly so that the
    // placeholders we generate for group parents (which in the absence of more info, we assume to
    // be non-groups) can be replaced with groups.
    //
    // TODO(cleanup):  The placeholder approach is really breaking down.  Maybe we need to maintain
    //   a list of expectations for nodes we haven't loaded yet.
    if (structNode.getIsGroup()) {
      if (replacement.getIsGroup()) {
        VALIDATE_SCHEMA(replacementScopeId == scopeId, "group node's scope changed");
      } else {
        replacementIsOlder();
      }
    } else {
      if (replacement.getIsGroup()) {
        replacementIsNewer();
      }
    }
  }